

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O2

IDiagObjectAddress * __thiscall
Js::VariableWalkerBase::FindPropertyAddress
          (VariableWalkerBase *this,PropertyId propId,bool *isConst)

{
  Type pDVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  undefined4 *puVar5;
  Type *ppDVar6;
  undefined4 extraout_var;
  uint index;
  List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  
  (*(this->super_IDiagObjectModelWalkerBase)._vptr_IDiagObjectModelWalkerBase[4])();
  this_00 = this->pMembersList;
  if (this_00 !=
      (List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
       *)0x0) {
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    for (index = 0;
        (int)index <
        (this_00->
        super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>
        ).count; index = index + 1) {
      ppDVar6 = JsUtil::
                List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item(this_00,index);
      pDVar1 = *ppDVar6;
      if (pDVar1 == (Type)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                    ,0x1c8,"(pair)","pair");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar5 = 0;
      }
      if (pDVar1->propId == propId) {
        *isConst = (bool)((byte)pDVar1->flags & 1);
        iVar4 = (*(this->super_IDiagObjectModelWalkerBase)._vptr_IDiagObjectModelWalkerBase[5])
                          (this,(ulong)index);
        return (IDiagObjectAddress *)CONCAT44(extraout_var,iVar4);
      }
      this_00 = this->pMembersList;
    }
  }
  return (IDiagObjectAddress *)0x0;
}

Assistant:

IDiagObjectAddress *VariableWalkerBase::FindPropertyAddress(PropertyId propId, bool& isConst)
    {
        PopulateMembers();
        if (pMembersList)
        {
            for (int i = 0; i < pMembersList->Count(); i++)
            {
                DebuggerPropertyDisplayInfo *pair = pMembersList->Item(i);
                Assert(pair);
                if (pair->propId == propId)
                {
                    isConst = pair->IsConst();
                    return GetObjectAddress(i);
                }
            }
        }
        return nullptr;
    }